

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::optimizeIfReturn
          (SimplifyLocals<true,_true,_true> *this,If *iff,Expression **currp)

{
  pointer *pppIVar1;
  pointer puVar2;
  Index IVar3;
  Block *this_00;
  iterator __position;
  size_t sVar4;
  Module *pMVar5;
  Expression **ppEVar6;
  LocalSet *this_01;
  Type TVar7;
  bool bVar8;
  mapped_type *pmVar9;
  Expression *pEVar10;
  ulong uVar11;
  MixedArena *this_02;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Type local_50;
  Type localType;
  Index goodIndex;
  If *local_38;
  If *iff_local;
  
  if ((((iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id == 0) &&
      ((iff->ifTrue->type).id == 0)) &&
     ((this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    localType.id._4_4_ =
         (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
    local_38 = iff;
    local_50 = Function::getLocalType
                         ((this->
                          super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                          ).
                          super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          .
                          super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          .
                          super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          .currFunction,localType.id._4_4_);
    bVar8 = wasm::Type::isDefaultable(&local_50);
    if (bVar8) {
      this_00 = (Block *)local_38->ifTrue;
      if ((((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) && ((this_00->name).super_IString.str._M_str == (char *)0x0)) &&
         ((sVar4 = (this_00->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements, sVar4 != 0 &&
          ((this_00->list).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
           [sVar4 - 1]->_id == NopId)))) {
        pMVar5 = (this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_PostWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .
                 super_Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                 .currModule;
        pmVar9 = std::
                 map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                 ::at(&this->sinkables,(key_type *)((long)&localType.id + 4));
        ppEVar6 = pmVar9->item;
        this_01 = (LocalSet *)*ppEVar6;
        if ((this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
            LocalSetId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
        }
        sVar4 = (this_00->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        if (sVar4 == 0) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data[sVar4 - 1] = this_01->value;
        this_02 = &pMVar5->allocator;
        uVar11 = 0x10;
        pEVar10 = (Expression *)MixedArena::allocSpace(this_02,0x10,8);
        pEVar10->_id = NopId;
        (pEVar10->type).id = 0;
        *ppEVar6 = pEVar10;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
        Block::finalize(this_00,type_,Unknown);
        TVar7.id = local_50.id;
        if ((this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
            0) {
          __assert_fail("ifTrueBlock->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x33a,
                        "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
        IVar3 = this_01->index;
        uVar11 = 0x18;
        pEVar10 = (Expression *)MixedArena::allocSpace(this_02,0x18,8);
        pEVar10->_id = LocalGetId;
        *(Index *)(pEVar10 + 1) = IVar3;
        (pEVar10->type).id = TVar7.id;
        local_38->ifFalse = pEVar10;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
        If::finalize(local_38,type__00);
        puVar2 = (this->getCounter).num.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + this_01->index;
        *puVar2 = *puVar2 + 1;
        if ((local_38->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id
            == 0) {
          __assert_fail("iff->type != Type::none",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                        ,0x340,
                        "void wasm::SimplifyLocals<>::optimizeIfReturn(If *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                       );
        }
        this_01->value = (Expression *)local_38;
        LocalSet::finalize(this_01);
        *currp = (Expression *)this_01;
        this->anotherCycle = true;
      }
      else {
        __position._M_current =
             (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::If*,std::allocator<wasm::If*>>::_M_realloc_insert<wasm::If*const&>
                    ((vector<wasm::If*,std::allocator<wasm::If*>> *)&this->ifsToEnlarge,__position,
                     &local_38);
        }
        else {
          *__position._M_current = local_38;
          pppIVar1 = &(this->ifsToEnlarge).
                      super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void optimizeIfReturn(If* iff, Expression** currp) {
    // If this if is unreachable code, we have nothing to do.
    if (iff->type != Type::none || iff->ifTrue->type != Type::none) {
      return;
    }
    // Anything sinkable is good for us.
    if (sinkables.empty()) {
      return;
    }

    // Check if the type makes sense. A non-nullable local might be dangerous
    // here, as creating new local.gets for such locals is risky:
    //
    //  (func $silly
    //    (local $x (ref $T))
    //    (if
    //      (condition)
    //      (local.set $x ..)
    //    )
    //  )
    //
    // That local is silly as the write is never read. If we optimize it and add
    // a local.get, however, then we'd no longer validate (as no set would
    // dominate that new get in the if's else arm). Fixups would add a
    // ref.as_non_null around the local.get, which will then trap at runtime:
    //
    //  (func $silly
    //    (local $x (ref null $T))
    //    (local.set $x
    //      (if
    //        (condition)
    //        (..)
    //        (ref.as_non_null
    //          (local.get $x)
    //        )
    //      )
    //    )
    //  )
    //
    // In other words, local.get is not necessarily free of effects if the local
    // is non-nullable - it must have been set already. We could check that
    // here, but running that linear-time check may not be worth it as this
    // optimization is fairly minor, so just skip the non-nullable case (and in
    // general, the non-defaultable case, of say a tuple with a non-nullable
    // element).
    //
    // TODO investigate more
    Index goodIndex = sinkables.begin()->first;
    auto localType = this->getFunction()->getLocalType(goodIndex);
    if (!localType.isDefaultable()) {
      return;
    }

    // Ensure we have a place to write the return values for, if not, we
    // need another cycle.
    auto* ifTrueBlock = iff->ifTrue->dynCast<Block>();
    if (!ifTrueBlock || ifTrueBlock->name.is() ||
        ifTrueBlock->list.size() == 0 || !ifTrueBlock->list.back()->is<Nop>()) {
      ifsToEnlarge.push_back(iff);
      return;
    }

    // We can optimize!

    // Update the ifTrue side.
    Builder builder(*this->getModule());
    auto** item = sinkables.at(goodIndex).item;
    auto* set = (*item)->template cast<LocalSet>();
    ifTrueBlock->list[ifTrueBlock->list.size() - 1] = set->value;
    *item = builder.makeNop();
    ifTrueBlock->finalize();
    assert(ifTrueBlock->type != Type::none);
    // Update the ifFalse side.
    iff->ifFalse = builder.makeLocalGet(set->index, localType);
    iff->finalize(); // update type
    // Update the get count.
    getCounter.num[set->index]++;
    assert(iff->type != Type::none);
    // Finally, reuse the local.set on the iff itself.
    set->value = iff;
    set->finalize();
    *currp = set;
    anotherCycle = true;
  }